

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereEqualScanEst(Parse *pParse,WhereLoopBuilder *pBuilder,Expr *pExpr,tRowcnt *pnRow)

{
  Index *pIdx;
  uint uVar1;
  int local_58;
  tRowcnt local_54;
  int bOk;
  tRowcnt a [2];
  int rc;
  UnpackedRecord *pRec;
  int nEq;
  Index *p;
  tRowcnt *pnRow_local;
  Expr *pExpr_local;
  WhereLoopBuilder *pBuilder_local;
  Parse *pParse_local;
  
  pIdx = (pBuilder->pNew->u).btree.pIndex;
  uVar1 = (uint)(pBuilder->pNew->u).btree.nEq;
  unique0x00012000 = pBuilder->pRec;
  if (pBuilder->nRecValid < (int)(uVar1 - 1)) {
    pParse_local._4_4_ = 0xc;
  }
  else if (uVar1 < pIdx->nColumn) {
    a[0] = sqlite3Stat4ProbeSetValue
                     (pParse,pIdx,(UnpackedRecord **)(a + 1),pExpr,1,uVar1 - 1,&local_58);
    pBuilder->pRec = stack0xffffffffffffffb8;
    pParse_local._4_4_ = a[0];
    if (a[0] == 0) {
      if (local_58 == 0) {
        pParse_local._4_4_ = 0xc;
      }
      else {
        pBuilder->nRecValid = uVar1;
        whereKeyStats(pParse,pIdx,stack0xffffffffffffffb8,0,&local_54);
        *pnRow = bOk;
        pParse_local._4_4_ = a[0];
      }
    }
  }
  else {
    *pnRow = 1;
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int whereEqualScanEst(
  Parse *pParse,       /* Parsing & code generating context */
  WhereLoopBuilder *pBuilder,
  Expr *pExpr,         /* Expression for VALUE in the x=VALUE constraint */
  tRowcnt *pnRow       /* Write the revised row estimate here */
){
  Index *p = pBuilder->pNew->u.btree.pIndex;
  int nEq = pBuilder->pNew->u.btree.nEq;
  UnpackedRecord *pRec = pBuilder->pRec;
  int rc;                   /* Subfunction return code */
  tRowcnt a[2];             /* Statistics */
  int bOk;

  assert( nEq>=1 );
  assert( nEq<=p->nColumn );
  assert( p->aSample!=0 );
  assert( p->nSample>0 );
  assert( pBuilder->nRecValid<nEq );

  /* If values are not available for all fields of the index to the left
  ** of this one, no estimate can be made. Return SQLITE_NOTFOUND. */
  if( pBuilder->nRecValid<(nEq-1) ){
    return SQLITE_NOTFOUND;
  }

  /* This is an optimization only. The call to sqlite3Stat4ProbeSetValue()
  ** below would return the same value.  */
  if( nEq>=p->nColumn ){
    *pnRow = 1;
    return SQLITE_OK;
  }

  rc = sqlite3Stat4ProbeSetValue(pParse, p, &pRec, pExpr, 1, nEq-1, &bOk);
  pBuilder->pRec = pRec;
  if( rc!=SQLITE_OK ) return rc;
  if( bOk==0 ) return SQLITE_NOTFOUND;
  pBuilder->nRecValid = nEq;

  whereKeyStats(pParse, p, pRec, 0, a);
  WHERETRACE(0x10,("equality scan regions %s(%d): %d\n",
                   p->zName, nEq-1, (int)a[1]));
  *pnRow = a[1];
  
  return rc;
}